

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Rect::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Rect *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  pointer ppSVar2;
  MthdSolidFormat *pMVar3;
  MthdOperation *pMVar4;
  SingleMthdTest *this_01;
  result_type rVar5;
  MthdCtxPattern *this_02;
  Test *pTVar6;
  MthdVtxXy *this_03;
  MthdCtxSurf2D *this_04;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_2f9;
  vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>> *local_2f8
  ;
  undefined1 local_2f0 [32];
  MthdSolidFormat *local_2d0;
  MthdOperation *local_2c8;
  Test *local_2c0;
  Test *local_2b8;
  Test *local_2b0;
  Test *local_2a8;
  Test *local_2a0;
  Test *local_298;
  Test *local_290;
  Test *local_288;
  MthdCtxSurf2D *local_280;
  undefined1 local_278 [48];
  undefined1 *local_248;
  unsigned_long local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  unsigned_long local_220;
  undefined1 local_218 [16];
  undefined1 *local_208;
  unsigned_long local_200;
  undefined1 local_1f8 [16];
  undefined1 *local_1e8;
  unsigned_long local_1e0;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8;
  unsigned_long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  unsigned_long local_1a0;
  undefined1 local_198 [16];
  undefined1 *local_188;
  unsigned_long local_180;
  undefined1 local_178 [16];
  undefined1 *local_168;
  unsigned_long local_160;
  undefined1 local_158 [16];
  SingleMthdTest *local_148;
  Test *local_140;
  undefined1 local_138 [104];
  undefined1 *local_d0;
  unsigned_long local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_2f8 = (vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>
               *)__return_storage_ptr__;
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_278._40_8_ = this_01;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2f0._0_8_ = local_2f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar5);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_2f0._0_8_,(pointer)(local_2f0._0_8_ + local_2f0._8_8_));
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_148 = this_01;
  local_290 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_288 = (Test *)local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"notify","");
  pTVar6 = local_290;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_290,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_288,
             (long)&(local_280->super_SingleMthdTest).super_MthdTest.super_StateTest.
                    super_RepeatTest + (long)&(local_288 + 0x1e)[-0x1e]._vptr_Test);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_140 = pTVar6;
  local_298 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"patch","");
  pTVar6 = local_298;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_298,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x10c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_168,local_168 + local_160);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357830;
  local_138._0_8_ = pTVar6;
  local_2a0 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"pm_trigger","");
  pTVar6 = local_2a0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2a0,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_188,local_188 + local_180);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_138._8_8_ = pTVar6;
  local_2a8 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"dma_notify","");
  pTVar6 = local_2a8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2a8,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 1;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1a8,local_1a8 + local_1a0);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_138._16_8_ = pTVar6;
  local_2b0 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"ctx_clip","");
  pTVar6 = local_2b0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2b0,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x184;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 2;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1c8,local_1c8 + local_1c0);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357a20;
  local_138._24_8_ = pTVar6;
  this_02 = (MthdCtxPattern *)operator_new(0x25958);
  local_278._32_8_ = this_02;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ctx_pattern","");
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern(this_02,opt,(uint32_t)rVar5,&local_50,3,uVar1,0x188,uVar1 != 0x1e);
  local_138._32_8_ = this_02;
  local_2b8 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"ctx_rop","");
  pTVar6 = local_2b8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2b8,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 4;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_1e8,local_1e8 + local_1e0);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357b18;
  local_138._40_8_ = pTVar6;
  local_2c0 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"ctx_beta","");
  pTVar6 = local_2c0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_2c0,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 400;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 5;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_208,local_208 + local_200);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357c10;
  local_138._48_8_ = pTVar6;
  pTVar6 = (Test *)operator_new(0x25950);
  local_278._24_8_ = pTVar6;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"missing","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_228,local_228 + local_220);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035ad08;
  local_138._56_8_ = pTVar6;
  local_2c8 = (MthdOperation *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"operation","");
  pMVar4 = local_2c8;
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation(local_2c8,opt,(uint32_t)rVar5,&local_70,8,uVar1,0x2fc,uVar1 != 0x1e);
  local_138._64_8_ = pMVar4;
  local_2d0 = (MthdSolidFormat *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"format","");
  pMVar3 = local_2d0;
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (local_2d0,opt,(uint32_t)rVar5,&local_90,9,uVar1,0x300,uVar1 != 0x1e);
  local_138._72_8_ = pMVar3;
  pTVar6 = (Test *)operator_new(0x25950);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 10;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_248,local_248 + local_240);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a7d8;
  local_138._80_8_ = pTVar6;
  this_03 = (MthdVtxXy *)operator_new(0x25958);
  local_278._16_8_ = this_03;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"rect.xy","");
  MthdVtxXy::MthdVtxXy
            (this_03,opt,(uint32_t)rVar5,&local_b0,0xb,(this->super_Class).cls,0x400,0x10,8,1);
  local_138._88_8_ = this_03;
  pTVar6 = (Test *)operator_new(0x25958);
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"rect.rect","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar6,opt,(uint32_t)rVar5);
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_d0,local_d0 + local_c8);
  pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358148;
  *(undefined2 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 1;
  __l._M_len = 0xf;
  __l._M_array = &local_148;
  local_138._96_8_ = pTVar6;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector((vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_2f8,__l,&local_2f9);
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_288 != (Test *)local_278) {
    operator_delete(local_288);
  }
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    operator_delete((void *)local_2f0._0_8_);
  }
  ppSVar2 = *(pointer *)(local_2f8 + 8);
  if ((this->super_Class).cls == 0x1e) {
    pTVar6 = (Test *)operator_new(0x25958);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_148 = (SingleMthdTest *)local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ctx_dst","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 7;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_148,
               (long)(local_148->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_140->rnd + -1) + 0x1378U);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357450;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x119) = 0;
    local_2f0._0_8_ = pTVar6;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_2f8,ppSVar2,local_2f0);
    if (local_148 == (SingleMthdTest *)local_138) {
      return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              *)local_2f8;
    }
  }
  else {
    pTVar6 = (Test *)operator_new(0x25950);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_148 = (SingleMthdTest *)local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ctx_beta4","");
    uVar1 = (this->super_Class).cls;
    Test::Test(pTVar6,opt,(uint32_t)rVar5);
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x106) = 0xffffffff;
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
    *(uint32_t *)(pTVar6[0x1e].rnd._M_x + 0x112) = uVar1;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x894) = 0x194;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x113) = 4;
    *(undefined4 *)((long)pTVar6[0x1e].rnd._M_x + 0x89c) = 1;
    *(undefined4 *)(pTVar6[0x1e].rnd._M_x + 0x114) = 6;
    pTVar6[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar6[0x1e].rnd._M_x + 0x117);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pTVar6[0x1e].rnd._M_x + 0x115),local_148,
               (long)(local_148->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.rnd.
                     _M_x + (long)(&local_140->rnd + -1) + 0x1378U);
    pTVar6->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357d08;
    local_288 = pTVar6;
    this_04 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    local_2f0._0_8_ = local_2f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"ctx_surf2d","");
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_04,opt,(uint32_t)rVar5,(string *)local_2f0,7,(this->super_Class).cls,0x198,1);
    local_280 = this_04;
    std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>::
    _M_range_insert<hwtest::pgraph::SingleMthdTest*const*>(local_2f8,ppSVar2,&local_288);
    if ((Test *)local_2f0._0_8_ != (Test *)(local_2f0 + 0x10)) {
      operator_delete((void *)local_2f0._0_8_);
    }
    if (local_148 == (SingleMthdTest *)local_138) {
      return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
              *)local_2f8;
    }
  }
  operator_delete(local_148);
  return (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
          *)local_2f8;
}

Assistant:

std::vector<SingleMthdTest *> Rect::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1e),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdVeryMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1e),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1e),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "rect.xy", 11, cls, 0x400, 0x10, 8, VTX_FIRST),
		new MthdRect(opt, rnd(), "rect.rect", 12, cls, 0x404, 0x10, 8, VTX_DRAW),
	};
	if (cls == 0x1e) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}